

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIImage * __thiscall
irr::gui::CGUIEnvironment::addImage
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id,wchar_t *text,
          bool useAlphaChannel)

{
  rect<int> rectangle_00;
  byte bVar1;
  IGUIImage *pIVar2;
  int in_ECX;
  undefined8 *in_RSI;
  long in_R8;
  byte in_R9B;
  IGUIImage *img;
  IReferenceCounted *in_stack_ffffffffffffff98;
  IGUIEnvironment *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = in_R9B & 1;
  pIVar2 = (IGUIImage *)operator_new(0x188);
  rectangle_00.LowerRightCorner.X = in_stack_ffffffffffffffe0;
  rectangle_00.UpperLeftCorner.X = (int)in_R8;
  rectangle_00.UpperLeftCorner.Y = (int)((ulong)in_R8 >> 0x20);
  rectangle_00.LowerRightCorner.Y = in_ECX;
  CGUIImage::CGUIImage
            ((CGUIImage *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
             (IGUIElement *)in_RSI[1],(s32)((ulong)*in_RSI >> 0x20),rectangle_00);
  if (in_R8 != 0) {
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])(pIVar2,in_R8);
  }
  if ((bVar1 & 1) != 0) {
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x28])(pIVar2,1);
  }
  IReferenceCounted::drop(in_stack_ffffffffffffff98);
  return pIVar2;
}

Assistant:

IGUIImage *CGUIEnvironment::addImage(const core::rect<s32> &rectangle, IGUIElement *parent, s32 id, const wchar_t *text, bool useAlphaChannel)
{
	IGUIImage *img = new CGUIImage(this, parent ? parent : this,
			id, rectangle);

	if (text)
		img->setText(text);

	if (useAlphaChannel)
		img->setUseAlphaChannel(true);

	img->drop();
	return img;
}